

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamStandardIndex::CalculateCandidateOffsets
          (BamStandardIndex *this,BaiReferenceSummary *refSummary,uint64_t *minOffset,
          set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
          *candidateBins,vector<long,_std::allocator<long>_> *offsets)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  iterator __position;
  ulong uVar4;
  int iVar5;
  _Base_ptr p_Var6;
  const_iterator __position_00;
  ulong uVar7;
  ulong *puVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  int32_t numAlignmentChunks;
  uint32_t binId;
  int local_64;
  _Base_ptr local_60;
  undefined2 local_54 [2];
  ulong *local_50;
  ulong local_48;
  BaiReferenceSummary *local_40;
  _Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
  *local_38;
  
  local_48 = refSummary->FirstBinFilePosition;
  iVar9 = 0;
  local_50 = minOffset;
  Seek(this,(int64_t *)&local_48,0);
  if (0 < refSummary->NumBins) {
    local_60 = &(candidateBins->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_40 = refSummary;
    local_38 = (_Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
                *)candidateBins;
    do {
      ReadBinIntoBuffer(this,(uint32_t *)local_54,&local_64);
      p_Var6 = *(_Base_ptr *)((long)candidateBins + 0x10);
      __position_00._M_node = local_60;
      if (p_Var6 != (_Base_ptr)0x0) {
        do {
          bVar12 = (ushort)(short)p_Var6[1]._M_color < (ushort)local_54[0];
          if (!bVar12) {
            __position_00._M_node = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[bVar12];
        } while (p_Var6 != (_Base_ptr)0x0);
        if ((__position_00._M_node != local_60) &&
           ((ushort)(short)__position_00._M_node[1]._M_color <= (ushort)local_54[0])) {
          if (0 < local_64) {
            iVar10 = 0;
            lVar11 = 8;
            puVar8 = local_50;
            iVar5 = local_64;
            do {
              pcVar1 = (this->m_resources).Buffer;
              uVar2 = *(ulong *)(pcVar1 + lVar11 + -8);
              uVar3 = *(ulong *)(pcVar1 + lVar11);
              uVar7 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                      (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                      (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                      (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
              uVar4 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                      (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                      (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                      (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
              if (this->m_isBigEndian == false) {
                uVar7 = uVar3;
                uVar4 = uVar2;
              }
              if (*puVar8 <= uVar7) {
                __position._M_current =
                     (offsets->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                local_48 = uVar4;
                if (__position._M_current ==
                    (offsets->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                            (offsets,__position,(long *)&local_48);
                  puVar8 = local_50;
                  iVar5 = local_64;
                }
                else {
                  *__position._M_current = uVar4;
                  (offsets->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                  super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
              }
              iVar10 = iVar10 + 1;
              lVar11 = lVar11 + 0x10;
            } while (iVar10 < iVar5);
          }
          candidateBins =
               (set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
               local_38;
          std::
          _Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
          ::erase_abi_cxx11_(local_38,__position_00);
          refSummary = local_40;
          if (*(long *)((long)candidateBins + 0x28) == 0) {
            return;
          }
        }
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < refSummary->NumBins);
  }
  return;
}

Assistant:

void BamStandardIndex::CalculateCandidateOffsets(const BaiReferenceSummary& refSummary,
                                                 const uint64_t& minOffset,
                                                 set<uint16_t>& candidateBins,
                                                 vector<int64_t>& offsets)
{
    // seek to first bin
    Seek(refSummary.FirstBinFilePosition, SEEK_SET);

    // iterate over reference bins
    uint32_t binId;
    int32_t numAlignmentChunks;
    set<uint16_t>::iterator candidateBinIter;
    for ( int i = 0; i < refSummary.NumBins; ++i ) {

        // read bin contents (if successful, alignment chunks are now in m_buffer)
        ReadBinIntoBuffer(binId, numAlignmentChunks);

        // see if bin is a 'candidate bin'
        candidateBinIter = candidateBins.find(binId);

        // if not, move on to next bin
        if ( candidateBinIter == candidateBins.end() )
            continue;

        // otherwise, check bin's contents against for overlap
        else {

            size_t offset = 0;
            uint64_t chunkStart;
            uint64_t chunkStop;

            // iterate over alignment chunks
            for ( int j = 0; j < numAlignmentChunks; ++j ) {

                // read chunk start & stop from buffer
                memcpy((char*)&chunkStart, m_resources.Buffer+offset, sizeof(uint64_t));
                offset += sizeof(uint64_t);
                memcpy((char*)&chunkStop, m_resources.Buffer+offset, sizeof(uint64_t));
                offset += sizeof(uint64_t);

                // swap endian-ness if necessary
                if ( m_isBigEndian ) {
                    SwapEndian_64(chunkStart);
                    SwapEndian_64(chunkStop);
                }

                // store alignment chunk's start offset
                // if its stop offset is larger than our 'minOffset'
                if ( chunkStop >= minOffset )
                    offsets.push_back(chunkStart);
            }

            // 'pop' bin ID from candidate bins set
            candidateBins.erase(candidateBinIter);

            // quit if no more candidates
            if ( candidateBins.empty() )
                break;
        }
    }
}